

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode junkscan(char *url,size_t *urllen,uint flags)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t nfine;
  size_t n;
  uint flags_local;
  size_t *urllen_local;
  char *url_local;
  
  sVar1 = strlen(url);
  if (sVar1 < 0x7a1201) {
    sVar2 = strcspn(url,
                    "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f\x7f"
                   );
    if ((sVar2 == sVar1) &&
       (((flags & 0x800) != 0 || (pcVar3 = strchr(url,0x20), pcVar3 == (char *)0x0)))) {
      *urllen = sVar1;
      url_local._4_4_ = CURLUE_OK;
    }
    else {
      url_local._4_4_ = CURLUE_MALFORMED_INPUT;
    }
    return url_local._4_4_;
  }
  return CURLUE_MALFORMED_INPUT;
}

Assistant:

static CURLUcode junkscan(const char *url, size_t *urllen, unsigned int flags)
{
  static const char badbytes[]={
    /* */ 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07,
    0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f,
    0x10, 0x11, 0x12, 0x13, 0x14, 0x15, 0x16, 0x17,
    0x18, 0x19, 0x1a, 0x1b, 0x1c, 0x1d, 0x1e, 0x1f,
    0x7f, 0x00 /* null-terminate */
  };
  size_t n = strlen(url);
  size_t nfine;

  if(n > CURL_MAX_INPUT_LENGTH)
    /* excessive input length */
    return CURLUE_MALFORMED_INPUT;

  nfine = strcspn(url, badbytes);
  if((nfine != n) ||
     (!(flags & CURLU_ALLOW_SPACE) && strchr(url, ' ')))
    return CURLUE_MALFORMED_INPUT;

  *urllen = n;
  return CURLUE_OK;
}